

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_urlencode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  long lVar2;
  char *zString;
  ushort **ppuVar3;
  int nLen_00;
  long lVar4;
  char *zString_00;
  jx9_value *pjVar5;
  char *pcVar6;
  uchar zHex [3];
  int nLen;
  char local_46 [4];
  char local_42 [2];
  ushort **local_40;
  int local_34;
  
  if (0 < nArg) {
    zString = jx9_value_to_string(*apArg,&local_34);
    if (0 < (long)local_34) {
      local_46[2] = '\0';
      local_46[0] = '%';
      local_46[1] = '\0';
      pcVar6 = zString + local_34;
      ppuVar3 = __ctype_b_loc();
      do {
        lVar4 = 0;
        while ((bVar1 = zString[lVar4], ((*ppuVar3)[bVar1] & 8) != 0 ||
               ((bVar1 - 0x24 < 0x3c &&
                ((0x800000000000601U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) != 0))))) {
          lVar2 = lVar4 + 1;
          lVar4 = lVar4 + 1;
          if (pcVar6 <= zString + lVar2) {
            jx9_value_string(pCtx->pRet,zString,(int)lVar4);
            return 0;
          }
        }
        local_40 = ppuVar3;
        if (lVar4 != 0) {
          jx9_value_string(pCtx->pRet,zString,(int)lVar4);
        }
        if (bVar1 == 0x20) {
          local_42[0] = '+';
          pjVar5 = pCtx->pRet;
          zString_00 = local_42;
          nLen_00 = 1;
        }
        else {
          local_46[1] = "0123456789ABCDEF"[bVar1 >> 4];
          local_46[2] = "0123456789ABCDEF"[bVar1 & 0xf];
          pjVar5 = pCtx->pRet;
          zString_00 = local_46;
          nLen_00 = 3;
        }
        jx9_value_string(pjVar5,zString_00,nLen_00);
        zString = zString + lVar4 + 1;
        ppuVar3 = local_40;
      } while (zString < pcVar6);
      return 0;
    }
  }
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_urlencode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the input string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Nothing to process, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the URL encoding */
	SyUriEncode(zIn, (sxu32)nLen, Consumer, pCtx);
	return JX9_OK;
}